

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_var_statement_t *stmt)

{
  long lVar1;
  integer_variables_t *piVar2;
  clock_variables_t *pcVar3;
  bool bVar4;
  expression_type_t type;
  var_expression_t *pvVar5;
  string *psVar6;
  expression_t *expr;
  element_type *this_00;
  shared_ptr<tchecker::typed_local_var_statement_t> local_120;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  shared_ptr<tchecker::typed_expression_t> local_f0;
  undefined1 local_e0 [8];
  shared_ptr<const_tchecker::typed_expression_t> init;
  shared_ptr<tchecker::typed_expression_t> local_b0;
  undefined1 local_a0 [8];
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string name;
  statement_type_t stmt_type;
  local_var_statement_t *stmt_local;
  statement_typechecker_t *this_local;
  
  pvVar5 = local_var_statement_t::variable(stmt);
  psVar6 = var_expression_t::name_abi_cxx11_(pvVar5);
  std::__cxx11::string::string((string *)local_40,(string *)psVar6);
  bVar4 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&this->_localvars,(string *)local_40);
  if (bVar4) {
    name.field_2._12_4_ = 0;
    std::operator+(&local_70,"local variable already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->_error,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar4 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this->_intvars,(string *)local_40);
    if (bVar4) {
      name.field_2._12_4_ = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variable.
                      super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,"local variable already exists: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->_error,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable.
                    super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &variable.
                  super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      name.field_2._12_4_ = 9;
      integer_variables_t::declare(&this->_localvars,(string *)local_40,1,-0x80000000,0x7fffffff,0);
    }
  }
  pvVar5 = local_var_statement_t::variable(stmt);
  lVar1 = *(long *)(*(long *)pvVar5 + -0x38);
  piVar2 = this->_intvars;
  pcVar3 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&init.
                 super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,&this->_error);
  typecheck((tchecker *)&local_b0,(expression_t *)(&pvVar5->field_0x0 + lVar1),&this->_localvars,
            piVar2,pcVar3,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&init.
                super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)local_a0);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_b0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&init.
                  super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  expr = local_var_statement_t::initial_value(stmt);
  piVar2 = this->_intvars;
  pcVar3 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_110,&this->_error);
  typecheck((tchecker *)&local_f0,expr,&this->_localvars,piVar2,pcVar3,&local_110);
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_e0,&local_f0);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_f0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_110);
  this_00 = std::
            __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_e0);
  type = typed_expression_t::type(this_00);
  bVar4 = integer_valued(type);
  if (!bVar4) {
    name.field_2._12_4_ = 0;
  }
  std::
  make_shared<tchecker::typed_local_var_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            ((statement_type_t *)&local_120,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)((long)&name.field_2 + 0xc),
             (shared_ptr<const_tchecker::typed_expression_t> *)local_a0);
  std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_120);
  std::shared_ptr<tchecker::typed_local_var_statement_t>::~shared_ptr(&local_120);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_e0);
  std::shared_ptr<const_tchecker::typed_var_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_var_expression_t> *)local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

virtual void visit(tchecker::local_var_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type;

    std::string name = stmt.variable().name();
    if (_localvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else {
      stmt_type = tchecker::STMT_TYPE_LOCAL_INT;
      _localvars.declare(name, 1, tchecker::int_minval, tchecker::int_maxval, 0);
    }

    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> init{
        tchecker::typecheck(stmt.initial_value(), _localvars, _intvars, _clocks, _error)};

    if (!tchecker::integer_valued(init->type()))
      stmt_type = tchecker::STMT_TYPE_BAD;

    _typed_stmt = std::make_shared<tchecker::typed_local_var_statement_t>(stmt_type, variable, init);
  }